

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkmaze.c
# Opt level: O0

void movebubbles(void)

{
  obj *otmp_00;
  xchar xVar1;
  container *pcVar3;
  trap *ptVar4;
  rm *prVar5;
  bubble *local_b8;
  uint local_b0;
  uint local_a4;
  bubble *local_88;
  bubble *local_80;
  monst *local_78;
  bubble *local_70;
  int ry;
  int rx;
  container *cons_3;
  container *cons_2;
  container *cons_1;
  monst *mon;
  container *cons;
  obj *otmp;
  obj *olist;
  trap *btrap;
  int j;
  int i;
  int y;
  int x;
  bubble *b;
  xchar xVar2;
  
  if (wportal == (trap *)0x0) {
    set_wportal(level);
  }
  vision_recalc(2);
  if (uball != (obj *)0x0) {
    unplacebc();
  }
  if (bubble_up == '\0') {
    local_70 = ebubbles;
  }
  else {
    local_70 = bbubbles;
  }
  _y = local_70;
  while( true ) {
    if (_y == (bubble *)0x0) {
      bubble_up = (bubble_up != '\0' ^ 0xffU) & 1;
      if (bubble_up == 0) {
        local_88 = ebubbles;
      }
      else {
        local_88 = bbubbles;
      }
      _y = local_88;
      while (_y != (bubble *)0x0) {
        local_a4 = rn2(3);
        local_b0 = rn2(3);
        if (_y->dx != '\0') {
          local_a4 = (uint)(local_a4 != 0);
        }
        if (_y->dy != '\0') {
          local_b0 = (uint)(local_b0 != 0);
        }
        mv_bubble(level,_y,(_y->dx + 1) - local_a4,(_y->dy + 1) - local_b0,'\0');
        if (bubble_up == '\0') {
          local_b8 = _y->prev;
        }
        else {
          local_b8 = _y->next;
        }
        _y = local_b8;
      }
      if (uball != (obj *)0x0) {
        placebc();
      }
      vision_full_recalc = '\x01';
      return;
    }
    if (_y->cons != (container *)0x0) break;
    btrap._4_4_ = 0;
    i = (int)_y->x;
    for (; btrap._4_4_ < (int)(uint)*_y->bm; btrap._4_4_ = btrap._4_4_ + 1) {
      btrap._0_4_ = 0;
      j = (int)_y->y;
      for (; (int)btrap < (int)(uint)_y->bm[1]; btrap._0_4_ = (int)btrap + 1) {
        if (((uint)_y->bm[(int)btrap + 2] & 1 << ((byte)btrap._4_4_ & 0x1f)) != 0) {
          if ((((i < 1) || (0x4f < i)) || (j < 0)) || (0x14 < j)) {
            impossible("movebubbles: bad pos (%d,%d)",(ulong)(uint)i,(ulong)(uint)j);
          }
          else {
            xVar1 = (xchar)i;
            xVar2 = (xchar)j;
            if (level->objects[i][j] != (obj *)0x0) {
              otmp = (obj *)0x0;
              pcVar3 = (container *)malloc(0x18);
              while (otmp_00 = level->objects[i][j], otmp_00 != (obj *)0x0) {
                remove_object(otmp_00);
                otmp_00->oy = '\0';
                otmp_00->ox = '\0';
                (otmp_00->v).v_nexthere = otmp;
                otmp = otmp_00;
              }
              pcVar3->x = xVar1;
              pcVar3->y = xVar2;
              pcVar3->what = 0;
              pcVar3->list = otmp;
              pcVar3->next = _y->cons;
              _y->cons = pcVar3;
            }
            if ((level->monsters[i][j] != (monst *)0x0) &&
               ((*(uint *)&level->monsters[i][j]->field_0x60 >> 9 & 1) == 0)) {
              if ((level->monsters[i][j] == (monst *)0x0) ||
                 ((*(uint *)&level->monsters[i][j]->field_0x60 >> 9 & 1) != 0)) {
                local_78 = (monst *)0x0;
              }
              else {
                local_78 = level->monsters[i][j];
              }
              pcVar3 = (container *)malloc(0x18);
              pcVar3->x = xVar1;
              pcVar3->y = xVar2;
              pcVar3->what = 1;
              pcVar3->list = local_78;
              pcVar3->next = _y->cons;
              _y->cons = pcVar3;
              if (local_78->wormno == '\0') {
                remove_monster(level,i,j);
              }
              else {
                remove_worm(local_78);
              }
              newsym(i,j);
              local_78->my = '\0';
              local_78->mx = '\0';
            }
            if ((((u._1052_1_ & 1) == 0) && (i == u.ux)) && (j == u.uy)) {
              pcVar3 = (container *)malloc(0x18);
              pcVar3->x = xVar1;
              pcVar3->y = xVar2;
              pcVar3->what = 2;
              pcVar3->list = (void *)0x0;
              pcVar3->next = _y->cons;
              _y->cons = pcVar3;
            }
            ptVar4 = t_at(level,i,j);
            if (ptVar4 != (trap *)0x0) {
              pcVar3 = (container *)malloc(0x18);
              pcVar3->x = xVar1;
              pcVar3->y = xVar2;
              pcVar3->what = 3;
              pcVar3->list = ptVar4;
              pcVar3->next = _y->cons;
              _y->cons = pcVar3;
            }
            prVar5 = level->locations[i] + j;
            *(undefined4 *)&prVar5->field_0x0 = 0x14;
            prVar5->typ = '\x13';
            prVar5->seenv = '\0';
            *(undefined2 *)&prVar5->field_0x6 = 0;
            *(undefined4 *)&prVar5->field_0x8 = 0;
            block_point(i,j);
          }
        }
        j = j + 1;
      }
      i = i + 1;
    }
    if (bubble_up == '\0') {
      local_80 = _y->prev;
    }
    else {
      local_80 = _y->next;
    }
    _y = local_80;
  }
  panic("movebubbles: cons != null");
}

Assistant:

void movebubbles(void)
{
	struct bubble *b;
	int x, y, i, j;
	struct trap *btrap;
	static const struct rm water_pos = { S_water, 0, 0, 0, 0, 0,
		WATER /* typ */, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0 };

	/* set up the portal the first time bubbles are moved */
	if (!wportal) set_wportal(level);

	vision_recalc(2);
	/* keep attached ball&chain separate from bubble objects */
	if (Punished) unplacebc();

	/*
	 * Pick up everything inside of a bubble then fill all bubble
	 * locations.
	 */

	for (b = bubble_up ? bbubbles : ebubbles; b; b = bubble_up ? b->next : b->prev) {
	    if (b->cons) panic("movebubbles: cons != null");
	    for (i = 0, x = b->x; i < (int) b->bm[0]; i++, x++)
		for (j = 0, y = b->y; j < (int) b->bm[1]; j++, y++)
		    if (b->bm[j + 2] & (1 << i)) {
			if (!isok(x,y)) {
			    impossible("movebubbles: bad pos (%d,%d)", x,y);
			    continue;
			}

			/* pick up objects, monsters, hero, and traps */
			if (OBJ_AT(x, y)) {
			    struct obj *olist = NULL, *otmp;
			    struct container *cons =
				malloc(sizeof(struct container));

			    while ((otmp = level->objects[x][y]) != 0) {
				remove_object(otmp);
				otmp->ox = otmp->oy = 0;
				otmp->nexthere = olist;
				olist = otmp;
			    }

			    cons->x = x;
			    cons->y = y;
			    cons->what = CONS_OBJ;
			    cons->list = olist;
			    cons->next = b->cons;
			    b->cons = cons;
			}
			if (MON_AT(level, x,y)) {
			    struct monst *mon = m_at(level, x,y);
			    struct container *cons =
				malloc(sizeof(struct container));

			    cons->x = x;
			    cons->y = y;
			    cons->what = CONS_MON;
			    cons->list = mon;

			    cons->next = b->cons;
			    b->cons = cons;

			    if (mon->wormno)
				remove_worm(mon);
			    else
				remove_monster(level, x, y);

			    newsym(x,y);	/* clean up old position */
			    mon->mx = mon->my = 0;
			}
			if (!u.uswallow && x == u.ux && y == u.uy) {
			    struct container *cons =
				malloc(sizeof(struct container));

			    cons->x = x;
			    cons->y = y;
			    cons->what = CONS_HERO;
			    cons->list = NULL;

			    cons->next = b->cons;
			    b->cons = cons;
			}
			if ((btrap = t_at(level, x, y)) != 0) {
			    struct container *cons =
				malloc(sizeof(struct container));

			    cons->x = x;
			    cons->y = y;
			    cons->what = CONS_TRAP;
			    cons->list = btrap;

			    cons->next = b->cons;
			    b->cons = cons;
			}

			level->locations[x][y] = water_pos;
			block_point(x,y);
		    }
	}

	/*
	 * Every second time traverse down.  This is because otherwise
	 * all the junk that changes owners when bubbles overlap
	 * would eventually end up in the last bubble in the chain.
	 */

	bubble_up = !bubble_up;
	for (b = bubble_up ? bbubbles : ebubbles; b; b = bubble_up ? b->next : b->prev) {
		int rx = rn2(3), ry = rn2(3);

		mv_bubble(level, b, b->dx + 1 - (!b->dx ? rx : (rx ? 1 : 0)),
			    b->dy + 1 - (!b->dy ? ry : (ry ? 1 : 0)),
			    FALSE);
	}

	/* put attached ball&chain back */
	if (Punished) placebc();
	vision_full_recalc = 1;
}